

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetCompileDefinitions
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language)

{
  cmMakefile *this_00;
  cmLocalGenerator *this_01;
  pointer ppTVar1;
  PolicyStatus PVar2;
  char *pcVar3;
  size_t sVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  long *plVar6;
  size_type *psVar7;
  PolicyID id;
  pointer ppTVar8;
  bool debugOptions;
  undefined1 local_318 [32];
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  linkInterfaceCompileDefinitionsEntries;
  string configPropName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  string local_298;
  cmListFileBacktrace local_278;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250 [6];
  ios_base local_1f0 [264];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueOptions;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uniqueOptions._M_h._M_buckets = &uniqueOptions._M_h._M_single_bucket;
  uniqueOptions._M_h._M_bucket_count = 1;
  uniqueOptions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  uniqueOptions._M_h._M_element_count = 0;
  uniqueOptions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  uniqueOptions._M_h._M_rehash_policy._M_next_resize = 0;
  uniqueOptions._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"COMPILE_DEFINITIONS","");
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&dagChecker,this,&local_298,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = this->Makefile;
  _e = (pointer)local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&e,"CMAKE_DEBUG_TARGET_PROPERTIES","");
  pcVar3 = cmMakefile::GetDefinition(this_00,(string *)&e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_e != local_250) {
    operator_delete(_e,local_250[0]._M_allocated_capacity + 1);
  }
  if (pcVar3 != (char *)0x0) {
    _e = (pointer)local_250;
    sVar4 = strlen(pcVar3);
    std::__cxx11::string::_M_construct<char_const*>((string *)&e,pcVar3,pcVar3 + sVar4);
    cmSystemTools::ExpandListArgument((string *)&e,&debugProperties,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_e != local_250) {
      operator_delete(_e,local_250[0]._M_allocated_capacity + 1);
    }
  }
  if (this->DebugCompileDefinitionsDone == false) {
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[20]>>
                      (debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,"COMPILE_DEFINITIONS");
    debugOptions = _Var5._M_current !=
                   debugProperties.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    debugOptions = false;
  }
  if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
    this->DebugCompileDefinitionsDone = true;
  }
  processOptionsInternal
            (this,&this->CompileDefinitionsEntries,__return_storage_ptr__,&uniqueOptions,&dagChecker
             ,config,debugOptions,"compile definitions",language,None);
  linkInterfaceCompileDefinitionsEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkInterfaceCompileDefinitionsEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  linkInterfaceCompileDefinitionsEntries.
  super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _e = (pointer)local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&e,"INTERFACE_COMPILE_DEFINITIONS","");
  AddInterfaceEntries(this,config,(string *)&e,&linkInterfaceCompileDefinitionsEntries);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_e != local_250) {
    operator_delete(_e,local_250[0]._M_allocated_capacity + 1);
  }
  if (config->_M_string_length == 0) goto LAB_00330229;
  cmsys::SystemTools::UpperCase((string *)&e,config);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&e,0,(char *)0x0,0x4de65b);
  configPropName._M_dataplus._M_p = (pointer)&configPropName.field_2;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar7) {
    configPropName.field_2._M_allocated_capacity = *psVar7;
    configPropName.field_2._8_8_ = plVar6[3];
  }
  else {
    configPropName.field_2._M_allocated_capacity = *psVar7;
    configPropName._M_dataplus._M_p = (pointer)*plVar6;
  }
  configPropName._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_e != local_250) {
    operator_delete(_e,local_250[0]._M_allocated_capacity + 1);
  }
  pcVar3 = GetProperty(this,&configPropName);
  if (pcVar3 != (char *)0x0) {
    PVar2 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0043,false);
    if (PVar2 != OLD) {
      if (PVar2 != WARN) goto LAB_0033020d;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_318,(cmPolicies *)0x2b,id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&e,(char *)local_318._0_8_,local_318._8_8_);
      if ((TargetPropertyEntry *)local_318._0_8_ != (TargetPropertyEntry *)(local_318 + 0x10)) {
        operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
      }
      this_01 = this->LocalGenerator;
      std::__cxx11::stringbuf::str();
      cmLocalGenerator::IssueMessage(this_01,AUTHOR_WARNING,(string *)local_318);
      if ((TargetPropertyEntry *)local_318._0_8_ != (TargetPropertyEntry *)(local_318 + 0x10)) {
        operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      std::ios_base::~ios_base(local_1f0);
    }
    _e = (pointer)local_250;
    sVar4 = strlen(pcVar3);
    std::__cxx11::string::_M_construct<char_const*>((string *)&e,pcVar3,pcVar3 + sVar4);
    local_278.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_278.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_318._0_8_ = CreateTargetPropertyEntry((string *)&e,&local_278,false);
    std::
    vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
    ::emplace_back<cmGeneratorTarget::TargetPropertyEntry*>
              ((vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
                *)&linkInterfaceCompileDefinitionsEntries,(TargetPropertyEntry **)local_318);
    if (local_278.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_278.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_e != local_250) {
      operator_delete(_e,local_250[0]._M_allocated_capacity + 1);
    }
  }
LAB_0033020d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)configPropName._M_dataplus._M_p != &configPropName.field_2) {
    operator_delete(configPropName._M_dataplus._M_p,configPropName.field_2._M_allocated_capacity + 1
                   );
  }
LAB_00330229:
  processOptionsInternal
            (this,&linkInterfaceCompileDefinitionsEntries,__return_storage_ptr__,&uniqueOptions,
             &dagChecker,config,debugOptions,"compile definitions",language,None);
  ppTVar1 = linkInterfaceCompileDefinitionsEntries.
            super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar8 = linkInterfaceCompileDefinitionsEntries.
                 super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppTVar8 != ppTVar1;
      ppTVar8 = ppTVar8 + 1) {
    if (*ppTVar8 != (TargetPropertyEntry *)0x0) {
      (*(*ppTVar8)->_vptr_TargetPropertyEntry[1])();
    }
  }
  if (linkInterfaceCompileDefinitionsEntries.
      super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(linkInterfaceCompileDefinitionsEntries.
                    super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)linkInterfaceCompileDefinitionsEntries.
                          super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)linkInterfaceCompileDefinitionsEntries.
                          super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&debugProperties);
  if (dagChecker.Backtrace.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (dagChecker.Backtrace.TopEntry.
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&dagChecker.Seen._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dagChecker.Property._M_dataplus._M_p != &dagChecker.Property.field_2) {
    operator_delete(dagChecker.Property._M_dataplus._M_p,
                    dagChecker.Property.field_2._M_allocated_capacity + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&uniqueOptions._M_h);
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetCompileDefinitions(
  std::string const& config, std::string const& language) const
{
  std::vector<BT<std::string>> list;
  std::unordered_set<std::string> uniqueOptions;

  cmGeneratorExpressionDAGChecker dagChecker(this, "COMPILE_DEFINITIONS",
                                             nullptr, nullptr);

  std::vector<std::string> debugProperties;
  const char* debugProp =
    this->Makefile->GetDefinition("CMAKE_DEBUG_TARGET_PROPERTIES");
  if (debugProp) {
    cmSystemTools::ExpandListArgument(debugProp, debugProperties);
  }

  bool debugDefines = !this->DebugCompileDefinitionsDone &&
    std::find(debugProperties.begin(), debugProperties.end(),
              "COMPILE_DEFINITIONS") != debugProperties.end();

  if (this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    this->DebugCompileDefinitionsDone = true;
  }

  processCompileDefinitions(this, this->CompileDefinitionsEntries, list,
                            uniqueOptions, &dagChecker, config, debugDefines,
                            language);

  std::vector<cmGeneratorTarget::TargetPropertyEntry*>
    linkInterfaceCompileDefinitionsEntries;
  AddInterfaceEntries(this, config, "INTERFACE_COMPILE_DEFINITIONS",
                      linkInterfaceCompileDefinitionsEntries);
  if (!config.empty()) {
    std::string configPropName =
      "COMPILE_DEFINITIONS_" + cmSystemTools::UpperCase(config);
    const char* configProp = this->GetProperty(configPropName);
    if (configProp) {
      switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0043)) {
        case cmPolicies::WARN: {
          std::ostringstream e;
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0043);
          this->LocalGenerator->IssueMessage(MessageType::AUTHOR_WARNING,
                                             e.str());
          CM_FALLTHROUGH;
        }
        case cmPolicies::OLD: {
          linkInterfaceCompileDefinitionsEntries.push_back(
            CreateTargetPropertyEntry(configProp));
        } break;
        case cmPolicies::NEW:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::REQUIRED_IF_USED:
          break;
      }
    }
  }

  processCompileDefinitions(this, linkInterfaceCompileDefinitionsEntries, list,
                            uniqueOptions, &dagChecker, config, debugDefines,
                            language);

  cmDeleteAll(linkInterfaceCompileDefinitionsEntries);
  return list;
}